

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Set_irreg_distr(int g_a,int *map,int *block)

{
  Integer IVar1;
  Integer *__ptr;
  long in_RDX;
  int in_EDI;
  int i;
  Integer *_ga_map_capi;
  Integer _ga_work [7];
  Integer ndim;
  Integer aa;
  int local_74;
  long local_68;
  int *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  Integer *in_stack_ffffffffffffffb0;
  Integer *in_stack_ffffffffffffffb8;
  Integer in_stack_ffffffffffffffc0;
  
  IVar1 = pnga_get_dimension((long)in_EDI);
  for (local_74 = 0; local_74 < IVar1; local_74 = local_74 + 1) {
    (&local_68)[(IVar1 - local_74) + -1] = (long)*(int *)(in_RDX + (long)local_74 * 4);
  }
  __ptr = copy_map((int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa0);
  pnga_set_irreg_distr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  free(__ptr);
  return;
}

Assistant:

void GA_Set_irreg_distr(int g_a, int map[], int block[])
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map(block, (int)ndim, map);

    wnga_set_irreg_distr(aa, _ga_map_capi, _ga_work);
    free(_ga_map_capi);
}